

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aes.c
# Opt level: O0

int aes_xts_cipher(void *vctx,uchar *out,size_t *outl,size_t outsize,uchar *in,size_t inl)

{
  int iVar1;
  ulong *in_RDX;
  long in_RSI;
  char *in_RDI;
  char *in_R8;
  ulong in_R9;
  int unaff_retaddr;
  PROV_AES_XTS_CTX *ctx;
  int local_4;
  
  iVar1 = ossl_prov_is_running();
  if ((((iVar1 == 0) || (*(long *)(in_RDI + 0x2b0) == 0)) || (*(long *)(in_RDI + 0x2b8) == 0)) ||
     (((((byte)in_RDI[0x3c] >> 2 & 1) == 0 || (in_RSI == 0)) ||
      ((in_R8 == (char *)0x0 || (in_R9 < 0x10)))))) {
    local_4 = 0;
  }
  else if (in_R9 < 0x1000001) {
    if (*(long *)(in_RDI + 0x2d0) == 0) {
      iVar1 = CRYPTO_xts128_encrypt
                        ((XTS128_CONTEXT *)outl,(uchar *)outsize,in,(uchar *)inl,(size_t)ctx,
                         unaff_retaddr);
      if (iVar1 != 0) {
        return 0;
      }
    }
    else {
      (**(code **)(in_RDI + 0x2d0))
                (in_R8,in_RSI,in_R9,*(undefined8 *)(in_RDI + 0x2b0),*(undefined8 *)(in_RDI + 0x2b8),
                 in_RDI + 0x94);
    }
    *in_RDX = in_R9;
    local_4 = 1;
  }
  else {
    ERR_new();
    ERR_set_debug(in_R8,(int)(in_R9 >> 0x20),in_RDI);
    ERR_set_error(0x39,0x94,(char *)0x0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int aes_xts_cipher(EVP_CIPHER_CTX *ctx, unsigned char *out,
                          const unsigned char *in, size_t len)
{
    EVP_AES_XTS_CTX *xctx = EVP_C_DATA(EVP_AES_XTS_CTX,ctx);

    if (xctx->xts.key1 == NULL
            || xctx->xts.key2 == NULL
            || out == NULL
            || in == NULL
            || len < AES_BLOCK_SIZE)
        return 0;

    /*
     * Impose a limit of 2^20 blocks per data unit as specified by
     * IEEE Std 1619-2018.  The earlier and obsolete IEEE Std 1619-2007
     * indicated that this was a SHOULD NOT rather than a MUST NOT.
     * NIST SP 800-38E mandates the same limit.
     */
    if (len > XTS_MAX_BLOCKS_PER_DATA_UNIT * AES_BLOCK_SIZE) {
        ERR_raise(ERR_LIB_EVP, EVP_R_XTS_DATA_UNIT_IS_TOO_LARGE);
        return 0;
    }

    if (xctx->stream)
        (*xctx->stream) (in, out, len,
                         xctx->xts.key1, xctx->xts.key2,
                         ctx->iv);
    else if (CRYPTO_xts128_encrypt(&xctx->xts, ctx->iv, in, out, len,
                                   EVP_CIPHER_CTX_is_encrypting(ctx)))
        return 0;
    return 1;
}